

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_dialer_get_url(nng_dialer id,nng_url **urlp)

{
  int iVar1;
  nni_dialer *in_RAX;
  nng_url *pnVar2;
  nni_dialer *local_18;
  nni_dialer *d;
  
  local_18 = in_RAX;
  iVar1 = nni_dialer_find(&local_18,id.id);
  if (iVar1 == 0) {
    pnVar2 = nni_dialer_url(local_18);
    *urlp = pnVar2;
    nni_dialer_rele(local_18);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_dialer_get_url(nng_dialer id, const nng_url **urlp)
{
	int         rv;
	nni_dialer *d;
	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	*urlp = nni_dialer_url(d);
	nni_dialer_rele(d);
	return (0);
}